

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O3

int If_LogCounterAddAig(int *pTimes,int *pnTimes,int *pFaninLits,int Num,int iLit,Vec_Int_t *vAig,
                       int nSuppAll,int fXor,int fXorFunc)

{
  int iVar1;
  uint Entry;
  uint Entry_00;
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  iVar3 = *pnTimes;
  uVar5 = (ulong)iVar3;
  if (vAig != (Vec_Int_t *)0x0) {
    pFaninLits[uVar5] = iLit;
  }
  iVar8 = iVar3 + 1;
  pTimes[uVar5] = Num;
  if (0 < iVar3) {
    do {
      uVar7 = uVar5 & 0xffffffff;
      iVar3 = pTimes[uVar7];
      uVar2 = uVar5 - 1 & 0xffffffff;
      iVar1 = pTimes[uVar2];
      if (iVar3 < iVar1) break;
      iVar6 = (int)uVar5;
      if (iVar1 < iVar3) {
        pTimes[uVar7] = iVar1;
        pTimes[uVar2] = iVar3;
        if (vAig != (Vec_Int_t *)0x0) {
          iVar3 = pFaninLits[uVar7];
          pFaninLits[uVar7] = pFaninLits[uVar2];
          pFaninLits[uVar2] = iVar3;
        }
      }
      else {
        pTimes[uVar2] = iVar1 + 1;
        if (vAig != (Vec_Int_t *)0x0) {
          Entry = pFaninLits[uVar7];
          if (((int)Entry < 0) || (Entry_00 = pFaninLits[uVar2], (int)Entry_00 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10c,"int Abc_Lit2Var(int)");
          }
          if ((Entry_00 ^ Entry) < 2) {
            __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCount.h"
                          ,0x3c,"int If_LogCreateAnd(Vec_Int_t *, int, int, int)");
          }
          iVar3 = vAig->nSize;
          Vec_IntPush(vAig,Entry);
          Vec_IntPush(vAig,Entry_00);
          iVar3 = iVar3 / 2 + nSuppAll;
          if (iVar3 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10b,"int Abc_Var2Lit(int, int)");
          }
          pFaninLits[uVar2] = iVar3 * 2;
        }
        iVar8 = iVar8 + -1;
        if (iVar6 < iVar8) {
          lVar4 = 0;
          do {
            pTimes[uVar7 + lVar4] = pTimes[uVar7 + lVar4 + 1];
            if (vAig != (Vec_Int_t *)0x0) {
              pFaninLits[uVar7 + lVar4] = pFaninLits[uVar7 + lVar4 + 1];
            }
            lVar4 = lVar4 + 1;
          } while (iVar6 + (int)lVar4 < iVar8);
        }
      }
      uVar5 = uVar5 - 1;
    } while (1 < iVar6);
  }
  if (iVar8 < 1) {
    __assert_fail("nTimes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCount.h"
                  ,0x77,
                  "int If_LogCounterAddAig(int *, int *, int *, int, int, Vec_Int_t *, int, int, int)"
                 );
  }
  *pnTimes = iVar8;
  return (uint)(iVar8 != 1) + *pTimes;
}

Assistant:

static inline int If_LogCounterAddAig( int * pTimes, int * pnTimes, int * pFaninLits, int Num, int iLit, Vec_Int_t * vAig, int nSuppAll, int fXor, int fXorFunc )
{
    int nTimes = *pnTimes;
    if ( vAig )
        pFaninLits[nTimes] = iLit;
    pTimes[nTimes++] = Num;
    if ( nTimes > 1 )
    {
        int i, k;
        for ( k = nTimes-1; k > 0; k-- )
        {
            if ( pTimes[k] < pTimes[k-1] )
                break;
            if ( pTimes[k] > pTimes[k-1] )
            { 
                ABC_SWAP( int, pTimes[k], pTimes[k-1] ); 
                if ( vAig )
                    ABC_SWAP( int, pFaninLits[k], pFaninLits[k-1] ); 
                continue; 
            }
            pTimes[k-1] += 1 + fXor;
            if ( vAig )
                pFaninLits[k-1] = If_LogCreateAndXor( vAig, pFaninLits[k], pFaninLits[k-1], nSuppAll, fXorFunc );
            for ( nTimes--, i = k; i < nTimes; i++ )
            {
                pTimes[i] = pTimes[i+1];
                if ( vAig )
                    pFaninLits[i] = pFaninLits[i+1];
            }
        }
    }
    assert( nTimes > 0 );
    *pnTimes = nTimes;
    return pTimes[0] + (nTimes > 1 ? 1 + fXor : 0);
}